

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

xmlDocPtr xmlSAXParseEntity(xmlSAXHandlerPtr sax,char *filename)

{
  xmlParserCtxtPtr ctxt;
  size_t __n;
  _xmlSAXHandler *__s;
  xmlDocPtr cur;
  
  cur = (xmlDocPtr)0x0;
  ctxt = xmlCreateURLParserCtxt(filename,0);
  if (ctxt != (xmlParserCtxtPtr)0x0) {
    if (sax != (xmlSAXHandlerPtr)0x0) {
      __s = ctxt->sax;
      __n = 0x100;
      if (sax->initialized != 0xdeedbeaf) {
        memset(__s,0,0x100);
        __s = ctxt->sax;
        __n = 0xe0;
      }
      memcpy(__s,sax,__n);
      ctxt->userData = (void *)0x0;
    }
    xmlParseExtParsedEnt(ctxt);
    cur = ctxt->myDoc;
    if (ctxt->wellFormed == 0) {
      xmlFreeDoc(cur);
      cur = (xmlDocPtr)0x0;
    }
    xmlFreeParserCtxt(ctxt);
  }
  return cur;
}

Assistant:

xmlDocPtr
xmlSAXParseEntity(xmlSAXHandlerPtr sax, const char *filename) {
    xmlDocPtr ret;
    xmlParserCtxtPtr ctxt;

    ctxt = xmlCreateFileParserCtxt(filename);
    if (ctxt == NULL) {
	return(NULL);
    }
    if (sax != NULL) {
        if (sax->initialized == XML_SAX2_MAGIC) {
            *ctxt->sax = *sax;
        } else {
            memset(ctxt->sax, 0, sizeof(*ctxt->sax));
            memcpy(ctxt->sax, sax, sizeof(xmlSAXHandlerV1));
        }
        ctxt->userData = NULL;
    }

    xmlParseExtParsedEnt(ctxt);

    if (ctxt->wellFormed) {
	ret = ctxt->myDoc;
    } else {
        ret = NULL;
        xmlFreeDoc(ctxt->myDoc);
    }

    xmlFreeParserCtxt(ctxt);

    return(ret);
}